

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turtlebot.cpp
# Opt level: O3

void __thiscall chrono::turtlebot::Turtlebot_Part::AddVisualizationAssets(Turtlebot_Part *this)

{
  element_type *peVar1;
  long *plVar2;
  ChTriangleMeshShape *this_00;
  undefined **ppuVar3;
  double *size;
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  string vis_mesh_file;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  long *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  ChTriangleMeshShape *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_170;
  long *local_168;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  long *local_130 [2];
  long local_120 [2];
  undefined **local_110;
  long local_108;
  undefined *puStack_100;
  long local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ChMatrix33<double> local_d0;
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 local_68;
  undefined1 auStack_60 [24];
  undefined8 local_48;
  undefined1 auStack_40 [24];
  undefined8 local_28;
  
  std::operator+(&local_150,"robot/turtlebot/",&this->m_mesh_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  ppuVar3 = (undefined **)(plVar2 + 2);
  if ((undefined **)*plVar2 == ppuVar3) {
    puStack_100 = *ppuVar3;
    local_f8 = plVar2[3];
    local_110 = &puStack_100;
  }
  else {
    puStack_100 = *ppuVar3;
    local_110 = (undefined **)*plVar2;
  }
  local_108 = plVar2[1];
  *plVar2 = (long)ppuVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  chrono::GetChronoDataFile((string *)local_130);
  if (local_110 != &puStack_100) {
    operator_delete(local_110,(ulong)(puStack_100 + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)&local_188,SUB81(local_130,0),true);
  local_88 = (this->m_offset).m_data[0];
  dStack_80 = (this->m_offset).m_data[1];
  size = &local_88;
  local_78 = (this->m_offset).m_data[2];
  auStack_60 = SUB3224(ZEXT832(0),0) << 0x20;
  auStack_40 = SUB3224(ZEXT832(0),4);
  local_68 = 0x3ff0000000000000;
  local_48 = 0x3ff0000000000000;
  local_28 = 0x3ff0000000000000;
  (**(code **)(*local_188 + 0x80))();
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)size);
  chrono::ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&local_190,this_00);
  local_168 = local_188;
  p_Stack_160 = p_Stack_180;
  if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_180->_M_use_count = p_Stack_180->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_180->_M_use_count = p_Stack_180->_M_use_count + 1;
    }
  }
  chrono::ChTriangleMeshShape::SetMesh(this_00,&local_168,1);
  if (p_Stack_160 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_160);
  }
  std::__cxx11::string::_M_assign((string *)(this_00 + 0x40));
  this_00[9] = (ChTriangleMeshShape)0x0;
  peVar1 = (this->m_body).super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_170 = local_190._M_pi;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_190._M_pi)->_M_use_count = (local_190._M_pi)->_M_use_count + 1;
    }
  }
  local_150._M_dataplus._M_p = &DAT_3ff0000000000000;
  local_150._M_string_length = 0;
  local_150.field_2._M_allocated_capacity = 0;
  local_150.field_2._8_8_ = 0;
  local_110 = &PTR__ChFrame_0017db90;
  local_108 = 0;
  puStack_100 = (undefined *)0x0;
  local_f8 = 0;
  local_f0 = 0x3ff0000000000000;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0;
  local_178 = this_00;
  ChMatrix33<double>::ChMatrix33(&local_d0,(ChQuaternion<double> *)&local_150);
  chrono::ChPhysicsItem::AddVisualShape(peVar1,&local_178,&local_110);
  if (local_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170);
  }
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  return;
}

Assistant:

void Turtlebot_Part::AddVisualizationAssets() {
    auto vis_mesh_file = GetChronoDataFile("robot/turtlebot/" + m_mesh_name + ".obj");
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(vis_mesh_file, true, true);
    trimesh->Transform(m_offset, ChMatrix33<>(1));
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetName(m_mesh_name);
    trimesh_shape->SetMutable(false);
    m_body->AddVisualShape(trimesh_shape);
    return;
}